

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

Solver * Disa::build_solver(Solver_Config config)

{
  ostream *poVar1;
  source_location *in_RCX;
  variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
  *in_RDI;
  undefined4 in_stack_00000008;
  char in_stack_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  undefined **local_18;
  
  *(undefined8 *)in_RDI = 0;
  in_RDI[8] = (variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
               )0x5;
  switch(in_stack_00000008) {
  case 0:
    if (in_stack_0000000c == '\x01') {
      std::
      make_unique<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,Disa::Solver_Config&>
                ((Solver_Config *)&bStack_38);
      std::
      variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
      ::operator=(in_RDI,(unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>_>
                          *)&bStack_38);
      std::
      unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>_>
      ::~unique_ptr((unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>_>
                     *)&bStack_38);
    }
    else {
      std::
      make_unique<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,Disa::Solver_Config&>
                ((Solver_Config *)&bStack_38);
      std::
      variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
      ::operator=(in_RDI,(unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>_>
                          *)&bStack_38);
      std::
      unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>_>
      ::~unique_ptr((unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>_>
                     *)&bStack_38);
    }
    break;
  case 1:
    std::
    make_unique<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,Disa::Solver_Config&>
              ((Solver_Config *)&bStack_38);
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>_>
                        *)&bStack_38);
    std::
    unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>_>
    ::~unique_ptr((unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>_>
                   *)&bStack_38);
    break;
  case 2:
    std::
    make_unique<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,Disa::Solver_Config&>
              ((Solver_Config *)&bStack_38);
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>_>_>
                        *)&bStack_38);
    std::
    unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>_>_>
    ::~unique_ptr((unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>_>_>
                   *)&bStack_38);
    break;
  case 3:
    std::
    make_unique<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,Disa::Solver_Config&>
              ((Solver_Config *)&bStack_38);
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>_>_>
                        *)&bStack_38);
    std::
    unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>_>_>
    ::~unique_ptr((unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>_>_>
                   *)&bStack_38);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_18 = &PTR_s__workspace_llm4binary_github_lic_0014fb38;
    console_format_abi_cxx11_(&bStack_38,(Disa *)0x0,(Log_Level)&local_18,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&bStack_38);
    poVar1 = std::operator<<(poVar1,"Undefined.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&bStack_38);
    exit(0);
  }
  return (Solver *)in_RDI;
}

Assistant:

Solver build_solver(Solver_Config config) {
  Solver solver;
  switch(config.type) {
    case Solver_Type::lower_upper_factorisation:
      if(config.pivot) solver.solver = std::make_unique<Solver_LUP<0>>(config);
      else solver.solver = std::make_unique<Solver_LU<0>>(config);
      break;
    case Solver_Type::jacobi:
      solver.solver = std::make_unique<Solver_Jacobi>(config);
      break;
    case Solver_Type::gauss_seidel:
      solver.solver = std::make_unique<Solver_Gauss_Seidel>(config);
      break;
    case Solver_Type::successive_over_relaxation:
      solver.solver = std::make_unique<Sover_Sor>(config);
      break;
    default:
      ERROR("Undefined.");
      exit(0);
  }
  return solver;
}